

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O3

Msat_Solver_t *
Msat_SolverAlloc(int nVarsAlloc,double dClaInc,double dClaDecay,double dVarInc,double dVarDecay,
                int fVerbose)

{
  size_t __size;
  undefined1 auVar1 [16];
  Msat_Solver_t *pSat;
  Msat_ClauseVec_t *pMVar2;
  double *__s;
  float *pfVar3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  Msat_Order_t *pMVar7;
  Msat_ClauseVec_t **ppMVar8;
  Msat_Queue_t *pMVar9;
  Msat_IntVec_t *pMVar10;
  Msat_Clause_t **ppMVar11;
  Msat_MmStep_t *pMVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pSat = (Msat_Solver_t *)calloc(1,0x148);
  pSat->nVarsAlloc = nVarsAlloc;
  pMVar2 = Msat_ClauseVecAlloc(0x200);
  pSat->vClauses = pMVar2;
  pMVar2 = Msat_ClauseVecAlloc(0x200);
  pSat->vLearned = pMVar2;
  pSat->dClaInc = dClaInc;
  pSat->dClaDecay = dClaDecay;
  pSat->dVarInc = dVarInc;
  pSat->dVarDecay = dVarDecay;
  __s = (double *)malloc((long)nVarsAlloc * 8);
  pSat->pdActivity = __s;
  __size = (long)nVarsAlloc * 4;
  pfVar3 = (float *)malloc(__size);
  pSat->pFactors = pfVar3;
  uVar4 = (ulong)(uint)nVarsAlloc;
  if (0 < nVarsAlloc) {
    lVar14 = 0;
    memset(__s,0,uVar4 * 8);
    auVar1 = _DAT_0094e250;
    lVar15 = uVar4 - 1;
    auVar16._8_4_ = (int)lVar15;
    auVar16._0_8_ = lVar15;
    auVar16._12_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar16 = auVar16 ^ _DAT_0094e250;
    auVar18 = _DAT_0094f530;
    auVar19 = _DAT_0094e240;
    do {
      auVar20 = auVar19 ^ auVar1;
      iVar17 = auVar16._4_4_;
      if ((bool)(~(auVar20._4_4_ == iVar17 && auVar16._0_4_ < auVar20._0_4_ ||
                  iVar17 < auVar20._4_4_) & 1)) {
        *(undefined4 *)((long)pfVar3 + lVar14) = 0x3f800000;
      }
      if ((auVar20._12_4_ != auVar16._12_4_ || auVar20._8_4_ <= auVar16._8_4_) &&
          auVar20._12_4_ <= auVar16._12_4_) {
        *(undefined4 *)((long)pfVar3 + lVar14 + 4) = 0x3f800000;
      }
      auVar20 = auVar18 ^ auVar1;
      iVar13 = auVar20._4_4_;
      if (iVar13 <= iVar17 && (iVar13 != iVar17 || auVar20._0_4_ <= auVar16._0_4_)) {
        *(undefined4 *)((long)pfVar3 + lVar14 + 8) = 0x3f800000;
        *(undefined4 *)((long)pfVar3 + lVar14 + 0xc) = 0x3f800000;
      }
      lVar15 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar15 + 4;
      lVar15 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar15 + 4;
      lVar14 = lVar14 + 0x10;
    } while ((ulong)(nVarsAlloc + 3U >> 2) << 4 != lVar14);
  }
  piVar5 = (int *)malloc(__size);
  pSat->pAssigns = piVar5;
  piVar6 = (int *)malloc(__size);
  pSat->pModel = piVar6;
  if (0 < nVarsAlloc) {
    memset(piVar5,0xff,uVar4 << 2);
  }
  pMVar7 = Msat_OrderAlloc(pSat);
  pSat->pOrder = pMVar7;
  iVar17 = pSat->nVarsAlloc;
  ppMVar8 = (Msat_ClauseVec_t **)malloc((long)iVar17 << 4);
  pSat->pvWatched = ppMVar8;
  if (0 < (long)iVar17) {
    lVar15 = 0;
    do {
      pMVar2 = Msat_ClauseVecAlloc(0x10);
      pSat->pvWatched[lVar15] = pMVar2;
      lVar15 = lVar15 + 1;
      iVar17 = pSat->nVarsAlloc;
    } while (SBORROW8(lVar15,(long)iVar17 * 2) != lVar15 + (long)iVar17 * -2 < 0);
  }
  pMVar9 = Msat_QueueAlloc(iVar17);
  pSat->pQueue = pMVar9;
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTrail = pMVar10;
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTrailLim = pMVar10;
  lVar15 = (long)pSat->nVarsAlloc;
  ppMVar11 = (Msat_Clause_t **)calloc(1,lVar15 * 8);
  pSat->pReasons = ppMVar11;
  piVar5 = (int *)malloc(lVar15 * 4);
  pSat->pLevel = piVar5;
  if (0 < lVar15) {
    memset(piVar5,0xff,lVar15 * 4);
  }
  pSat->dRandSeed = 91648253.0;
  pSat->fVerbose = fVerbose;
  pSat->dProgress = 0.0;
  pMVar12 = Msat_MmStepStart(10);
  pSat->pMem = pMVar12;
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vConeVars = pMVar10;
  pMVar2 = Msat_ClauseVecAlloc(pSat->nVarsAlloc);
  pSat->vAdjacents = pMVar2;
  iVar17 = pSat->nVarsAlloc;
  if (0 < iVar17) {
    iVar13 = 0;
    do {
      pMVar2 = pSat->vAdjacents;
      pMVar10 = Msat_IntVecAlloc(5);
      Msat_ClauseVecPush(pMVar2,(Msat_Clause_t *)pMVar10);
      iVar13 = iVar13 + 1;
      iVar17 = pSat->nVarsAlloc;
    } while (iVar13 < iVar17);
  }
  pMVar10 = Msat_IntVecAlloc(iVar17);
  pSat->vVarsUsed = pMVar10;
  Msat_IntVecFill(pMVar10,pSat->nVarsAlloc,1);
  iVar17 = pSat->nVarsAlloc;
  piVar5 = (int *)calloc(1,(long)iVar17 << 2);
  pSat->pSeen = piVar5;
  pSat->nSeenId = 1;
  pMVar10 = Msat_IntVecAlloc(iVar17);
  pSat->vReason = pMVar10;
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTemp = pMVar10;
  return pSat;
}

Assistant:

Msat_Solver_t * Msat_SolverAlloc( int nVarsAlloc,
    double dClaInc, double dClaDecay, 
    double dVarInc, double dVarDecay, 
    int  fVerbose )
{
    Msat_Solver_t * p;
    int i;

    assert(sizeof(Msat_Lit_t) == sizeof(unsigned));
    assert(sizeof(float)     == sizeof(unsigned));

    p = ABC_ALLOC( Msat_Solver_t, 1 );
    memset( p, 0, sizeof(Msat_Solver_t) );

    p->nVarsAlloc = nVarsAlloc;
    p->nVars     = 0;

    p->nClauses  = 0;
    p->vClauses  = Msat_ClauseVecAlloc( 512 );
    p->vLearned  = Msat_ClauseVecAlloc( 512 );

    p->dClaInc   = dClaInc;
    p->dClaDecay = dClaDecay;
    p->dVarInc   = dVarInc;
    p->dVarDecay = dVarDecay;

    p->pdActivity = ABC_ALLOC( double, p->nVarsAlloc );
    p->pFactors   = ABC_ALLOC( float, p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pdActivity[i] = 0.0;
        p->pFactors[i]   = 1.0;
    }

    p->pAssigns  = ABC_ALLOC( int, p->nVarsAlloc ); 
    p->pModel    = ABC_ALLOC( int, p->nVarsAlloc ); 
    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;
//    p->pOrder    = Msat_OrderAlloc( p->pAssigns, p->pdActivity, p->nVarsAlloc );
    p->pOrder    = Msat_OrderAlloc( p );

    p->pvWatched = ABC_ALLOC( Msat_ClauseVec_t *, 2 * p->nVarsAlloc );
    for ( i = 0; i < 2 * p->nVarsAlloc; i++ )
        p->pvWatched[i] = Msat_ClauseVecAlloc( 16 );
    p->pQueue    = Msat_QueueAlloc( p->nVarsAlloc );

    p->vTrail    = Msat_IntVecAlloc( p->nVarsAlloc );
    p->vTrailLim = Msat_IntVecAlloc( p->nVarsAlloc );
    p->pReasons  = ABC_ALLOC( Msat_Clause_t *, p->nVarsAlloc );
    memset( p->pReasons, 0, sizeof(Msat_Clause_t *) * p->nVarsAlloc );
    p->pLevel = ABC_ALLOC( int, p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pLevel[i] = -1;
    p->dRandSeed = 91648253;
    p->fVerbose  = fVerbose;
    p->dProgress = 0.0;
//    p->pModel = Msat_IntVecAlloc( p->nVarsAlloc );
    p->pMem = Msat_MmStepStart( 10 );

    p->vConeVars   = Msat_IntVecAlloc( p->nVarsAlloc ); 
    p->vAdjacents  = Msat_ClauseVecAlloc( p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
        Msat_ClauseVecPush( p->vAdjacents, (Msat_Clause_t *)Msat_IntVecAlloc(5) );
    p->vVarsUsed   = Msat_IntVecAlloc( p->nVarsAlloc ); 
    Msat_IntVecFill( p->vVarsUsed, p->nVarsAlloc, 1 );


    p->pSeen     = ABC_ALLOC( int, p->nVarsAlloc );
    memset( p->pSeen, 0, sizeof(int) * p->nVarsAlloc );
    p->nSeenId   = 1;
    p->vReason   = Msat_IntVecAlloc( p->nVarsAlloc );
    p->vTemp     = Msat_IntVecAlloc( p->nVarsAlloc );
    return p;
}